

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

bool __thiscall iDynTree::BerdyHelper::initOriginalBerdyFixedBase(BerdyHelper *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ostream *poVar7;
  SensorType *pSVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  stringstream ss;
  long *local_210;
  long local_208;
  long local_200 [2];
  uint local_1ec;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  ulong local_1c8;
  Traversal *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar4 = iDynTree::Model::getNrOfJoints();
  bVar12 = 0 < lVar4;
  if (0 < lVar4) {
    plVar5 = (long *)iDynTree::Model::getJoint((long)this);
    iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
    if (iVar2 == 1) {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + 1;
        lVar6 = iDynTree::Model::getNrOfJoints();
        bVar12 = lVar4 < lVar6;
        if (lVar6 <= lVar4) goto LAB_0012f2e8;
        plVar5 = (long *)iDynTree::Model::getJoint((long)this);
        iVar2 = (**(code **)(*plVar5 + 0x20))(plVar5);
      } while (iVar2 == 1);
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Joint ",6);
    iDynTree::Model::getJointName_abi_cxx11_((long)&local_210);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," has ",5);
    plVar5 = (long *)iDynTree::Model::getJoint((long)this);
    (**(code **)(*plVar5 + 0x20))(plVar5);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames"
               ,0x53);
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("BerdyHelpers","init",(char *)local_210);
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (bVar12) {
      return false;
    }
  }
LAB_0012f2e8:
  local_1ec = 0;
  local_1c0 = &this->m_dynamicsTraversal;
  uVar11 = 0;
  uVar3 = 0xffffffff;
  do {
    local_1c8 = uVar11;
    if (uVar3 < 4) {
      pSVar8 = (SensorType *)iDynTree::Model::sensors();
      lVar4 = iDynTree::SensorsList::getNrOfSensors(pSVar8);
      bVar12 = lVar4 != 0;
      if (bVar12) {
        uVar11 = 0;
        do {
          pSVar8 = (SensorType *)iDynTree::Model::sensors();
          uVar9 = iDynTree::SensorsList::getSensor(pSVar8,(long)&local_1ec);
          plVar5 = (long *)__dynamic_cast(uVar9,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
          lVar4 = (**(code **)(*plVar5 + 0x50))(plVar5);
          iDynTree::Traversal::getBaseLink();
          lVar6 = iDynTree::Link::getIndex();
          if (lVar4 == lVar6) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Sensor ",7);
            (**(code **)(*plVar5 + 0x10))(&local_210,plVar5);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(char *)local_210,local_208);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," is attached to link ",0x15);
            iDynTree::Model::getLinkName_abi_cxx11_((long)&local_1e8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_1e8,local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       " but this link is the base link and base link sensors are not supported by the original berdy."
                       ,0x5e);
            if (local_1e8 != local_1d8) {
              operator_delete(local_1e8,local_1d8[0] + 1);
            }
            if (local_210 != local_200) {
              operator_delete(local_210,local_200[0] + 1);
            }
            std::__cxx11::stringbuf::str();
            iDynTree::reportError("BerdyHelpers","init",(char *)local_210);
            if (local_210 != local_200) {
              operator_delete(local_210,local_200[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            if (bVar12) {
              if ((local_1c8 & 1) == 0) {
                return false;
              }
              goto LAB_0012f4f1;
            }
            break;
          }
          uVar11 = uVar11 + 1;
          pSVar8 = (SensorType *)iDynTree::Model::sensors();
          uVar10 = iDynTree::SensorsList::getNrOfSensors(pSVar8);
          bVar12 = uVar11 < uVar10;
        } while (bVar12);
      }
    }
    uVar1 = local_1ec + 1;
    uVar11 = (ulong)CONCAT31((int3)(uVar1 >> 8),3 < (int)local_1ec);
    bVar12 = 3 < (int)local_1ec;
    uVar3 = local_1ec;
    local_1ec = uVar1;
    if (bVar12) {
LAB_0012f4f1:
      lVar4 = iDynTree::Model::getNrOfDOFs();
      lVar6 = 0x14;
      if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables != false) {
        lVar6 = 0x1a;
      }
      this->m_nrOfDynamicalVariables = lVar6 * lVar4;
      this->m_nrOfDynamicEquations = lVar4 * 0x13;
      initSensorsMeasurements(this);
      return true;
    }
  } while( true );
}

Assistant:

bool BerdyHelper::initOriginalBerdyFixedBase()
{
    // Check that all joints have 1 dof
    for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
    {
        if( m_model.getJoint(jntIdx)->getNrOfDOFs() != 1 )
        {
            std::stringstream ss;
            ss << "Joint " << m_model.getJointName(jntIdx) << " has " << m_model.getJoint(jntIdx)->getNrOfDOFs() << " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames";
            reportError("BerdyHelpers","init",ss.str().c_str());
            return false;
        }
    }

    // Check that no sensors are attached to the base (this is not supported by the original berdy)
    for(SensorType type=SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type+1))
    {
        // TODO : link sensor are extremly widespared and they have all approximatly the same API,
        //        so we need a better way to iterate over them
        if( isLinkSensor(type) )
        {
            for(size_t sensIdx = 0; sensIdx < m_model.sensors().getNrOfSensors(type); sensIdx++)
            {
                LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(m_model.sensors().getSensor(type,sensIdx));

                LinkIndex   linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();

                if( linkToWhichTheSensorIsAttached == m_dynamicsTraversal.getBaseLink()->getIndex() )
                {
                    std::stringstream ss;
                    ss << "Sensor " << linkSensor->getName() << " is attached to link " << m_model.getLinkName(linkToWhichTheSensorIsAttached) << " but this link is the base link and base link sensors are not supported by the original berdy.";
                    reportError("BerdyHelpers","init",ss.str().c_str());
                    return false;
                }
            }
        }
    }


    // N will be the number of joints/links/dofs
    // We assume that the fixed base is fixed, so we include in the model only N links
    size_t nrOfDOFs = m_model.getNrOfDOFs();

    // In the classical Berdy formulation, we have 6*4 + 2*1 dynamical variables
    size_t nrOfDynamicVariablesForDOFs = m_options.includeAllNetExternalWrenchesAsDynamicVariables ? 6*4+2*1 : 6*3+2*1;
    m_nrOfDynamicalVariables = nrOfDynamicVariablesForDOFs*nrOfDOFs;
    // 19 Dynamics equations are considered in the original berdy :
    // 6 for the propagation of 6d acceleration
    // 6 for the computation of the net wrench from acc and vel
    // 6 for the computation of the joint wrench
    // 1 for the torque computations
    m_nrOfDynamicEquations   = (18+1)*nrOfDOFs;

    initSensorsMeasurements();

    return true;
}